

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf1_sync_info(bcf1_t *line,kstring_t *str)

{
  bcf_info_t *pbVar1;
  uint8_t **ppuVar2;
  bcf_info_t *pbVar3;
  bcf_info_t *pbVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  uint8_t *puVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  anon_union_4_2_947300a4_for_v1 aVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  anon_union_4_2_947300a4_for_v1 aVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  bcf_info_t tmp;
  
  uVar21 = 0xffffffffffffffff;
  uVar23 = 1;
  uVar22 = 0;
  do {
    uVar20 = (uint)uVar21;
    if ((*(ulong *)&line->field_0x10 & 0xffff) <= uVar22) {
      if (-1 < (int)uVar20) {
        *(ulong *)&line->field_0x10 =
             *(ulong *)&line->field_0x10 & 0xffffffffffff0000 | uVar21 & 0xffff;
      }
      return;
    }
    pbVar3 = (line->d).info;
    if (pbVar3[uVar22].vptr == (uint8_t *)0x0) {
      if ((int)uVar20 < 0) {
        uVar21 = uVar22;
      }
      uVar21 = uVar21 & 0xffffffff;
    }
    else {
      uVar18 = *(uint *)&pbVar3[uVar22].field_0x1c & 0x7fffffff;
      kputsn_(pbVar3[uVar22].vptr + -(ulong)uVar18,pbVar3[uVar22].vptr_len + uVar18,str);
      if (-1 < (int)uVar20) {
        pbVar4 = (line->d).info;
        uVar16 = uVar21 & 0xffffffff;
        pbVar3 = pbVar4 + uVar16;
        iVar12 = pbVar3->key;
        iVar13 = pbVar3->type;
        iVar14 = pbVar3->len;
        aVar15 = pbVar3->v1;
        puVar5 = pbVar4[uVar16].vptr;
        uVar6 = (&pbVar4[uVar16].vptr)[1];
        pbVar3 = pbVar4 + uVar22;
        iVar9 = pbVar3->type;
        iVar10 = pbVar3->len;
        aVar11 = pbVar3->v1;
        puVar7 = pbVar4[uVar22].vptr;
        uVar8 = (&pbVar4[uVar22].vptr)[1];
        pbVar1 = pbVar4 + uVar16;
        pbVar1->key = pbVar3->key;
        pbVar1->type = iVar9;
        pbVar1->len = iVar10;
        pbVar1->v1 = aVar11;
        pbVar4[uVar16].vptr = puVar7;
        (&pbVar4[uVar16].vptr)[1] = (uint8_t *)uVar8;
        pbVar3 = (line->d).info;
        ppuVar2 = &pbVar3[uVar22].vptr;
        *ppuVar2 = puVar5;
        ppuVar2[1] = (uint8_t *)uVar6;
        pbVar3 = pbVar3 + uVar22;
        pbVar3->key = iVar12;
        pbVar3->type = iVar13;
        pbVar3->len = iVar14;
        pbVar3->v1 = aVar15;
        uVar18 = uVar23;
        if ((int)uVar23 < (int)uVar20) {
          uVar18 = uVar20;
        }
        uVar19 = uVar16 * 0x20 | 0x10;
        for (lVar17 = uVar16 << 0x20; lVar17 >> 0x20 <= (long)uVar22; lVar17 = lVar17 + 0x100000000)
        {
          if (*(long *)((long)&((line->d).info)->key + uVar19) == 0) goto LAB_0011d3a1;
          uVar21 = (ulong)((int)uVar21 + 1);
          uVar19 = uVar19 + 0x20;
        }
        uVar21 = (ulong)uVar18;
      }
    }
LAB_0011d3a1:
    uVar22 = uVar22 + 1;
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

static inline void bcf1_sync_info(bcf1_t *line, kstring_t *str)
{
    // pairs of typed vectors
    int i, irm = -1;
    for (i=0; i<line->n_info; i++)
    {
        bcf_info_t *info = &line->d.info[i];
        if ( !info->vptr )
        {
            // marked for removal
            if ( irm < 0 ) irm = i;
            continue;
        }
        kputsn_(info->vptr - info->vptr_off, info->vptr_len + info->vptr_off, str);
        if ( irm >=0 )
        {
            bcf_info_t tmp = line->d.info[irm]; line->d.info[irm] = line->d.info[i]; line->d.info[i] = tmp;
            while ( irm<=i && line->d.info[irm].vptr ) irm++;
        }
    }
    if ( irm>=0 ) line->n_info = irm;
}